

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Block::Block(Block *this)

{
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x1493a5);
  this->FileOff = -1;
  memset(this->data,0,0x2000);
  return;
}

Assistant:

Block::Block(void) {
	this->BlockClear();
}